

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# relaxng.c
# Opt level: O1

xmlRelaxNGGrammarPtr_conflict xmlRelaxNGParseGrammar(xmlRelaxNGParserCtxtPtr ctxt,xmlNodePtr nodes)

{
  xmlRelaxNGGrammarPtr pxVar1;
  xmlRelaxNGGrammarPtr pxVar2;
  _xmlNode *p_Var3;
  int iVar4;
  int iVar5;
  xmlRelaxNGGrammarPtr_conflict pxVar6;
  xmlRelaxNGGrammarPtr *ppxVar7;
  xmlChar *pxVar8;
  xmlRelaxNGDefinePtr_conflict pxVar9;
  xmlHashTablePtr pxVar10;
  xmlRelaxNGGrammarPtr pxVar11;
  char *pcVar12;
  xmlNodePtr pxVar13;
  xmlChar *str1;
  xmlRelaxNGDefinePtr pxVar14;
  bool bVar15;
  bool bVar16;
  xmlChar local_58 [40];
  
  pxVar6 = (xmlRelaxNGGrammarPtr_conflict)(*xmlMalloc)(0x40);
  if (pxVar6 == (xmlRelaxNGGrammarPtr_conflict)0x0) {
    xmlRngPErrMemory(ctxt);
    pxVar6 = (xmlRelaxNGGrammarPtr_conflict)0x0;
  }
  else {
    pxVar6->defs = (xmlHashTablePtr)0x0;
    pxVar6->refs = (xmlHashTablePtr)0x0;
    *(undefined8 *)&pxVar6->combine = 0;
    pxVar6->startList = (xmlRelaxNGDefinePtr_conflict)0x0;
    pxVar6->next = (xmlRelaxNGGrammarPtr)0x0;
    pxVar6->start = (xmlRelaxNGDefinePtr_conflict)0x0;
    pxVar6->parent = (xmlRelaxNGGrammarPtr)0x0;
    pxVar6->children = (xmlRelaxNGGrammarPtr)0x0;
  }
  if (pxVar6 == (xmlRelaxNGGrammarPtr_conflict)0x0) {
    return (xmlRelaxNGGrammarPtr_conflict)0x0;
  }
  pxVar1 = ctxt->grammar;
  pxVar6->parent = pxVar1;
  if (pxVar1 != (xmlRelaxNGGrammarPtr)0x0) {
    pxVar2 = pxVar1->children;
    if (pxVar1->children == (xmlRelaxNGGrammarPtr)0x0) {
      ppxVar7 = &pxVar1->children;
    }
    else {
      do {
        pxVar11 = pxVar2;
        pxVar2 = pxVar11->next;
      } while (pxVar2 != (xmlRelaxNGGrammarPtr)0x0);
      ppxVar7 = &pxVar11->next;
    }
    *ppxVar7 = pxVar6;
  }
  ctxt->grammar = pxVar6;
  xmlRelaxNGParseGrammarContent(ctxt,nodes);
  ctxt->grammar = pxVar6;
  if (pxVar6->start == (xmlRelaxNGDefinePtr_conflict)0x0) {
    xmlRngPErr(ctxt,nodes,0x40f,"Element <grammar> has no <start>\n",(xmlChar *)0x0,(xmlChar *)0x0);
  }
  pxVar9 = pxVar6->start;
  if ((pxVar9 != (xmlRelaxNGDefinePtr_conflict)0x0) && (pxVar9->next != (xmlRelaxNGDefinePtr)0x0)) {
    iVar5 = -1;
    bVar15 = false;
    pxVar14 = pxVar9;
    do {
      if (((pxVar14->node == (xmlNodePtr)0x0) ||
          (p_Var3 = pxVar14->node->parent, p_Var3 == (_xmlNode *)0x0)) ||
         (iVar4 = xmlStrEqual(p_Var3->name,(xmlChar *)"start"), iVar4 == 0)) {
        xmlRngPErr(ctxt,pxVar14->node,0x453,"Internal error: start element not found\n",
                   (xmlChar *)0x0,(xmlChar *)0x0);
        pxVar8 = (xmlChar *)0x0;
      }
      else {
        pxVar8 = xmlGetProp(pxVar14->node->parent,(xmlChar *)"combine");
      }
      if (pxVar8 == (xmlChar *)0x0) {
        if (bVar15) {
          xmlRngPErr(ctxt,pxVar14->node,0x41e,"Some <start> element miss the combine attribute\n",
                     (xmlChar *)0x0,(xmlChar *)0x0);
        }
        bVar15 = true;
      }
      else {
        iVar4 = xmlStrEqual(pxVar8,(xmlChar *)"choice");
        if (iVar4 == 0) {
          iVar4 = xmlStrEqual(pxVar8,(xmlChar *)"interleave");
          if (iVar4 == 0) {
            pxVar13 = pxVar14->node;
            iVar4 = 0x45a;
            pcVar12 = "<start> uses unknown combine value \'%s\'\'\n";
            str1 = pxVar8;
            goto LAB_001849a1;
          }
          bVar16 = iVar5 == 1;
          iVar5 = 0;
          if (bVar16) {
            xmlRngPErr(ctxt,pxVar14->node,0x450,"<start> use both \'choice\' and \'interleave\'\n",
                       (xmlChar *)0x0,(xmlChar *)0x0);
            iVar5 = 1;
          }
        }
        else {
          bVar16 = iVar5 == 0;
          iVar5 = 1;
          if (bVar16) {
            pxVar13 = pxVar14->node;
            iVar5 = 0;
            iVar4 = 0x450;
            pcVar12 = "<start> use both \'choice\' and \'interleave\'\n";
            str1 = (xmlChar *)0x0;
LAB_001849a1:
            xmlRngPErr(ctxt,pxVar13,iVar4,pcVar12,str1,(xmlChar *)0x0);
          }
        }
        (*xmlFree)(pxVar8);
      }
      pxVar14 = pxVar14->next;
    } while (pxVar14 != (xmlRelaxNGDefinePtr)0x0);
    pxVar9 = xmlRelaxNGNewDefine(ctxt,pxVar9->node);
    if (pxVar9 != (xmlRelaxNGDefinePtr_conflict)0x0) {
      bVar15 = iVar5 + 1U < 2;
      pxVar9->type = bVar15 + 0x11 + (uint)bVar15;
      pxVar9->content = pxVar6->start;
      pxVar6->start = pxVar9;
      if (bVar15) {
        if (ctxt->interleaves == (xmlHashTablePtr)0x0) {
          pxVar10 = xmlHashCreate(10);
          ctxt->interleaves = pxVar10;
        }
        if (ctxt->interleaves == (xmlHashTablePtr)0x0) {
          pxVar13 = pxVar9->node;
          pcVar12 = "Failed to create interleaves hash table\n";
          pxVar8 = (xmlChar *)0x0;
        }
        else {
          ctxt->nbInterleaves = ctxt->nbInterleaves + 1;
          snprintf((char *)local_58,0x20,"interleave%d");
          iVar5 = xmlHashAddEntry(ctxt->interleaves,local_58,pxVar9);
          if (-1 < iVar5) goto LAB_00184a93;
          pxVar13 = pxVar9->node;
          pcVar12 = "Failed to add %s to hash table\n";
          pxVar8 = local_58;
        }
        xmlRngPErr(ctxt,pxVar13,0x416,pcVar12,pxVar8,(xmlChar *)0x0);
      }
    }
  }
LAB_00184a93:
  if (pxVar6->defs != (xmlHashTablePtr)0x0) {
    xmlHashScan(pxVar6->defs,xmlRelaxNGCheckCombine,ctxt);
  }
  if (pxVar6->refs != (xmlHashTablePtr)0x0) {
    xmlHashScan(pxVar6->refs,xmlRelaxNGCheckReference,ctxt);
  }
  ctxt->grammar = pxVar1;
  return pxVar6;
}

Assistant:

static xmlRelaxNGGrammarPtr
xmlRelaxNGParseGrammar(xmlRelaxNGParserCtxtPtr ctxt, xmlNodePtr nodes)
{
    xmlRelaxNGGrammarPtr ret, tmp, old;

    ret = xmlRelaxNGNewGrammar(ctxt);
    if (ret == NULL)
        return (NULL);

    /*
     * Link the new grammar in the tree
     */
    ret->parent = ctxt->grammar;
    if (ctxt->grammar != NULL) {
        tmp = ctxt->grammar->children;
        if (tmp == NULL) {
            ctxt->grammar->children = ret;
        } else {
            while (tmp->next != NULL)
                tmp = tmp->next;
            tmp->next = ret;
        }
    }

    old = ctxt->grammar;
    ctxt->grammar = ret;
    xmlRelaxNGParseGrammarContent(ctxt, nodes);
    ctxt->grammar = ret;
    if (ctxt->grammar == NULL) {
        xmlRngPErr(ctxt, nodes, XML_RNGP_GRAMMAR_CONTENT,
                   "Failed to parse <grammar> content\n", NULL, NULL);
    } else if (ctxt->grammar->start == NULL) {
        xmlRngPErr(ctxt, nodes, XML_RNGP_GRAMMAR_NO_START,
                   "Element <grammar> has no <start>\n", NULL, NULL);
    }

    /*
     * Apply 4.17 merging rules to defines and starts
     */
    xmlRelaxNGCombineStart(ctxt, ret);
    if (ret->defs != NULL) {
        xmlHashScan(ret->defs, xmlRelaxNGCheckCombine, ctxt);
    }

    /*
     * link together defines and refs in this grammar
     */
    if (ret->refs != NULL) {
        xmlHashScan(ret->refs, xmlRelaxNGCheckReference, ctxt);
    }


    /* @@@@ */

    ctxt->grammar = old;
    return (ret);
}